

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginMenu(char *label,bool enabled)

{
  ImGuiID IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImGuiID id_00;
  ImGuiWindow *this;
  value_type *pvVar4;
  value_type_conflict3 *pvVar5;
  bool bVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  ImVec2 IVar10;
  float _x;
  ImRect IVar11;
  bool local_14f;
  bool local_14e;
  byte local_14d;
  bool local_141;
  ImGuiWindowFlags flags;
  float local_e4;
  float fStack_e0;
  float extra;
  ImVec2 tc;
  ImVec2 tb;
  ImVec2 ta;
  ImRect next_window_rect;
  ImGuiWindow *next_window;
  bool moving_within_opened_triangle;
  bool want_close;
  bool want_open;
  bool hovered;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  float local_8c;
  float local_88;
  float extra_w;
  float w_1;
  ImVec2 local_7c;
  float local_74;
  ImVec2 IStack_70;
  float w;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 pos;
  ImVec2 popup_pos;
  ImGuiWindow *backed_nav_window;
  bool menuset_is_open;
  bool menu_is_open;
  bool pressed;
  ImVec2 label_size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  bool enabled_local;
  char *label_local;
  
  this = GetCurrentWindow();
  pIVar3 = GImGui;
  if ((this->SkipItems & 1U) == 0) {
    id_00 = ImGuiWindow::GetID(this,label,(char *)0x0);
    IVar10 = CalcTextSize(label,(char *)0x0,true,-1.0);
    backed_nav_window._2_1_ = IsPopupOpen(id_00);
    bVar6 = false;
    if (((this->Flags & 0x4000000U) == 0) &&
       (bVar6 = false, (pIVar3->CurrentPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
      pvVar4 = ImVector<ImGuiPopupRef>::operator[]
                         (&pIVar3->OpenPopupStack,(pIVar3->CurrentPopupStack).Size);
      IVar1 = pvVar4->OpenParentId;
      pvVar5 = ImVector<unsigned_int>::back(&this->IDStack);
      bVar6 = IVar1 == *pvVar5;
    }
    pIVar2 = pIVar3->NavWindow;
    if (bVar6) {
      pIVar3->NavWindow = this;
    }
    ImVec2::ImVec2(&pos);
    local_60 = (this->DC).CursorPos;
    backed_nav_window._4_4_ = IVar10.x;
    if ((this->DC).LayoutType == 1) {
      _x = local_60.x - (this->WindowPadding).x;
      fVar8 = local_60.y - (pIVar3->Style).FramePadding.y;
      fVar9 = ImGuiWindow::MenuBarHeight(this);
      ImVec2::ImVec2(&local_68,_x,fVar8 + fVar9);
      pos = local_68;
      (this->DC).CursorPos.x =
           (this->DC).CursorPos.x + (float)(int)((pIVar3->Style).ItemSpacing.x * 0.5);
      IStack_70 = ::operator*(&(pIVar3->Style).ItemSpacing,2.0);
      PushStyleVar(0xd,&stack0xffffffffffffff90);
      local_74 = backed_nav_window._4_4_;
      uVar7 = 0;
      if (((enabled ^ 0xffU) & 1) != 0) {
        uVar7 = 0x40;
      }
      ImVec2::ImVec2(&local_7c,backed_nav_window._4_4_,0.0);
      backed_nav_window._3_1_ = Selectable(label,backed_nav_window._2_1_,uVar7 | 0x19,&local_7c);
      PopStyleVar(1);
      (this->DC).CursorPos.x =
           (float)(int)((pIVar3->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
    }
    else {
      ImVec2::ImVec2((ImVec2 *)&extra_w,local_60.x,local_60.y - (pIVar3->Style).WindowPadding.y);
      pos = _extra_w;
      local_88 = ImGuiMenuColumns::DeclColumns
                           (&this->MenuColumns,backed_nav_window._4_4_,0.0,
                            (float)(int)(pIVar3->FontSize * 1.2));
      local_94 = GetContentRegionAvail();
      local_8c = ImMax<float>(0.0,local_94.x - local_88);
      uVar7 = 0;
      if (((enabled ^ 0xffU) & 1) != 0) {
        uVar7 = 0x40;
      }
      ImVec2::ImVec2(&local_9c,local_88,0.0);
      backed_nav_window._3_1_ = Selectable(label,backed_nav_window._2_1_,uVar7 | 0x99,&local_9c);
      if (!enabled) {
        PushStyleColor(0,(pIVar3->Style).Colors + 1);
      }
      ImVec2::ImVec2((ImVec2 *)((long)&next_window + 4),
                     pIVar3->FontSize * 0.3 + (this->MenuColumns).Pos[2] + local_8c,0.0);
      local_a4 = operator+(&local_60,(ImVec2 *)((long)&next_window + 4));
      RenderArrow(local_a4,1,1.0);
      if (!enabled) {
        PopStyleColor(1);
      }
    }
    local_141 = false;
    if (enabled) {
      local_141 = ItemHoverable(&(this->DC).LastItemRect,id_00);
    }
    next_window._3_1_ = local_141;
    if (bVar6) {
      pIVar3->NavWindow = pIVar2;
    }
    next_window._2_1_ = 0;
    next_window._1_1_ = 0;
    if ((this->DC).LayoutType == 0) {
      next_window._0_1_ = 0;
      if ((((pIVar3->HoveredWindow == this) &&
           ((pIVar3->CurrentPopupStack).Size < (pIVar3->OpenPopupStack).Size)) &&
          (pvVar4 = ImVector<ImGuiPopupRef>::operator[]
                              (&pIVar3->OpenPopupStack,(pIVar3->CurrentPopupStack).Size),
          pvVar4->ParentWindow == this)) && ((this->Flags & 0x400U) == 0)) {
        pvVar4 = ImVector<ImGuiPopupRef>::operator[]
                           (&pIVar3->OpenPopupStack,(pIVar3->CurrentPopupStack).Size);
        pIVar2 = pvVar4->Window;
        if (pIVar2 != (ImGuiWindow *)0x0) {
          IVar11 = ImGuiWindow::Rect(pIVar2);
          ta = IVar11.Min;
          tb = operator-(&(pIVar3->IO).MousePos,&(pIVar3->IO).MouseDelta);
          if ((pIVar2->Pos).x <= (this->Pos).x) {
            tc = ImRect::GetTR((ImRect *)&ta);
          }
          else {
            tc = ImRect::GetTL((ImRect *)&ta);
          }
          if ((pIVar2->Pos).x <= (this->Pos).x) {
            _fStack_e0 = ImRect::GetBR((ImRect *)&ta);
          }
          else {
            _fStack_e0 = ImRect::GetBL((ImRect *)&ta);
          }
          fVar8 = ImFabs(tb.x - tc.x);
          local_e4 = ImClamp<float>(fVar8 * 0.3,5.0,30.0);
          uVar7 = -(uint)((this->Pos).x < (pIVar2->Pos).x);
          fVar8 = tb.y;
          tb.x = (float)(~uVar7 & 0x3f000000 | uVar7 & 0xbf000000) + tb.x;
          fVar9 = ImMax<float>((tc.y - local_e4) - tb.y,-100.0);
          tc.y = fVar8 + fVar9;
          fVar8 = tb.y;
          fVar9 = ImMin<float>((extra + local_e4) - tb.y,100.0);
          extra = fVar8 + fVar9;
          next_window._0_1_ =
               ImTriangleContainsPoint
                         (&tb,&tc,(ImVec2 *)&stack0xffffffffffffff20,&(pIVar3->IO).MousePos);
        }
      }
      local_14d = 0;
      if (((backed_nav_window._2_1_) && (local_14d = 0, (next_window._3_1_ & 1) == 0)) &&
         ((local_14d = 0, pIVar3->HoveredWindow == this &&
          ((local_14d = 0, pIVar3->HoveredIdPreviousFrame != 0 &&
           (local_14d = 0, pIVar3->HoveredIdPreviousFrame != id_00)))))) {
        local_14d = (byte)next_window ^ 0xff;
      }
      if (((backed_nav_window._2_1_) || ((next_window._3_1_ & 1) == 0)) ||
         (local_14e = true, ((byte)next_window & 1) != 0)) {
        local_14f = false;
        if ((!backed_nav_window._2_1_) && (local_14f = false, (next_window._3_1_ & 1) != 0)) {
          local_14f = backed_nav_window._3_1_;
        }
        local_14e = local_14f;
      }
      next_window._1_1_ = local_14d & 1;
      if (pIVar3->NavActivateId == id_00) {
        local_14e = (bool)(backed_nav_window._2_1_ ^ 0xff);
        next_window._1_1_ = backed_nav_window._2_1_;
      }
      next_window._2_1_ = local_14e & 1;
      if (((pIVar3->NavId == id_00) && ((pIVar3->NavMoveRequest & 1U) != 0)) &&
         (pIVar3->NavMoveDir == 1)) {
        next_window._2_1_ = 1;
        NavMoveRequestCancel();
      }
    }
    else if (((backed_nav_window._2_1_) && (backed_nav_window._3_1_ != false)) && (bVar6)) {
      next_window._1_1_ = 1;
      backed_nav_window._2_1_ = false;
      next_window._2_1_ = 0;
    }
    else if ((backed_nav_window._3_1_ != false) ||
            (((local_141 != false && (bVar6)) && (!backed_nav_window._2_1_)))) {
      next_window._2_1_ = 1;
    }
    else if (((pIVar3->NavId == id_00) && ((pIVar3->NavMoveRequest & 1U) != 0)) &&
            (pIVar3->NavMoveDir == 3)) {
      next_window._2_1_ = 1;
      NavMoveRequestCancel();
    }
    if (!enabled) {
      next_window._1_1_ = 1;
    }
    if (((next_window._1_1_ & 1) != 0) && (bVar6 = IsPopupOpen(id_00), bVar6)) {
      ClosePopupToLevel((pIVar3->CurrentPopupStack).Size);
    }
    if (((backed_nav_window._2_1_ == false) && ((next_window._2_1_ & 1) != 0)) &&
       ((pIVar3->CurrentPopupStack).Size < (pIVar3->OpenPopupStack).Size)) {
      OpenPopup(label);
      label_local._7_1_ = false;
    }
    else {
      backed_nav_window._2_1_ = backed_nav_window._2_1_ != false || (next_window._2_1_ & 1) != 0;
      if ((next_window._2_1_ & 1) != 0) {
        OpenPopup(label);
      }
      if (backed_nav_window._2_1_) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff14,0.0,0.0);
        SetNextWindowPos(&pos,1,(ImVec2 *)&stack0xffffffffffffff14);
        uVar7 = 0x10000000;
        if ((this->Flags & 0x14000000U) != 0) {
          uVar7 = 0x11000000;
        }
        backed_nav_window._2_1_ = BeginPopupEx(id_00,uVar7 | 0x145);
      }
      label_local._7_1_ = backed_nav_window._2_1_;
    }
  }
  else {
    label_local._7_1_ = false;
  }
  return label_local._7_1_;
}

Assistant:

bool ImGui::BeginMenu(const char* label, bool enabled)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    ImVec2 label_size = CalcTextSize(label, NULL, true);

    bool pressed;
    bool menu_is_open = IsPopupOpen(id);
    bool menuset_is_open = !(window->Flags & ImGuiWindowFlags_Popup) && (g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].OpenParentId == window->IDStack.back());
    ImGuiWindow* backed_nav_window = g.NavWindow;
    if (menuset_is_open)
        g.NavWindow = window;  // Odd hack to allow hovering across menus of a same menu-set (otherwise we wouldn't be able to hover parent)

    // The reference position stored in popup_pos will be used by Begin() to find a suitable position for the child menu (using FindBestWindowPosForPopup).
    ImVec2 popup_pos, pos = window->DC.CursorPos;
    if (window->DC.LayoutType == ImGuiLayoutType_Horizontal)
    {
        // Menu inside an horizontal menu bar
        // Selectable extend their highlight by half ItemSpacing in each direction.
        // For ChildMenu, the popup position will be overwritten by the call to FindBestWindowPosForPopup() in Begin()
        popup_pos = ImVec2(pos.x - window->WindowPadding.x, pos.y - style.FramePadding.y + window->MenuBarHeight());
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * 0.5f);
        PushStyleVar(ImGuiStyleVar_ItemSpacing, style.ItemSpacing * 2.0f);
        float w = label_size.x;
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        PopStyleVar();
        window->DC.CursorPos.x += (float)(int)(style.ItemSpacing.x * (-1.0f + 0.5f)); // -1 spacing to compensate the spacing added when Selectable() did a SameLine(). It would also work to call SameLine() ourselves after the PopStyleVar().
    }
    else
    {
        // Menu inside a menu
        popup_pos = ImVec2(pos.x, pos.y - style.WindowPadding.y);
        float w = window->MenuColumns.DeclColumns(label_size.x, 0.0f, (float)(int)(g.FontSize * 1.20f)); // Feedback to next frame
        float extra_w = ImMax(0.0f, GetContentRegionAvail().x - w);
        pressed = Selectable(label, menu_is_open, ImGuiSelectableFlags_NoHoldingActiveID | ImGuiSelectableFlags_PressedOnClick | ImGuiSelectableFlags_DontClosePopups | ImGuiSelectableFlags_DrawFillAvailWidth | (!enabled ? ImGuiSelectableFlags_Disabled : 0), ImVec2(w, 0.0f));
        if (!enabled) PushStyleColor(ImGuiCol_Text, g.Style.Colors[ImGuiCol_TextDisabled]);
        RenderArrow(pos + ImVec2(window->MenuColumns.Pos[2] + extra_w + g.FontSize * 0.30f, 0.0f), ImGuiDir_Right);
        if (!enabled) PopStyleColor();
    }

    const bool hovered = enabled && ItemHoverable(window->DC.LastItemRect, id);
    if (menuset_is_open)
        g.NavWindow = backed_nav_window;

    bool want_open = false, want_close = false;
    if (window->DC.LayoutType == ImGuiLayoutType_Vertical) // (window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu))
    {
        // Implement http://bjk5.com/post/44698559168/breaking-down-amazons-mega-dropdown to avoid using timers, so menus feels more reactive.
        bool moving_within_opened_triangle = false;
        if (g.HoveredWindow == window && g.OpenPopupStack.Size > g.CurrentPopupStack.Size && g.OpenPopupStack[g.CurrentPopupStack.Size].ParentWindow == window && !(window->Flags & ImGuiWindowFlags_MenuBar))
        {
            if (ImGuiWindow* next_window = g.OpenPopupStack[g.CurrentPopupStack.Size].Window)
            {
                ImRect next_window_rect = next_window->Rect();
                ImVec2 ta = g.IO.MousePos - g.IO.MouseDelta;
                ImVec2 tb = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetTL() : next_window_rect.GetTR();
                ImVec2 tc = (window->Pos.x < next_window->Pos.x) ? next_window_rect.GetBL() : next_window_rect.GetBR();
                float extra = ImClamp(ImFabs(ta.x - tb.x) * 0.30f, 5.0f, 30.0f); // add a bit of extra slack.
                ta.x += (window->Pos.x < next_window->Pos.x) ? -0.5f : +0.5f;   // to avoid numerical issues
                tb.y = ta.y + ImMax((tb.y - extra) - ta.y, -100.0f);            // triangle is maximum 200 high to limit the slope and the bias toward large sub-menus // FIXME: Multiply by fb_scale?
                tc.y = ta.y + ImMin((tc.y + extra) - ta.y, +100.0f);
                moving_within_opened_triangle = ImTriangleContainsPoint(ta, tb, tc, g.IO.MousePos);
                //window->DrawList->PushClipRectFullScreen(); window->DrawList->AddTriangleFilled(ta, tb, tc, moving_within_opened_triangle ? IM_COL32(0,128,0,128) : IM_COL32(128,0,0,128)); window->DrawList->PopClipRect(); // Debug
            }
        }

        want_close = (menu_is_open && !hovered && g.HoveredWindow == window && g.HoveredIdPreviousFrame != 0 && g.HoveredIdPreviousFrame != id && !moving_within_opened_triangle);
        want_open = (!menu_is_open && hovered && !moving_within_opened_triangle) || (!menu_is_open && hovered && pressed);

        if (g.NavActivateId == id)
        {
            want_close = menu_is_open;
            want_open = !menu_is_open;
        }
        if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Right) // Nav-Right to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }
    else
    {
        // Menu bar
        if (menu_is_open && pressed && menuset_is_open) // Click an open menu again to close it
        {
            want_close = true;
            want_open = menu_is_open = false;
        }
        else if (pressed || (hovered && menuset_is_open && !menu_is_open)) // First click to open, then hover to open others
        {
            want_open = true;
        }
        else if (g.NavId == id && g.NavMoveRequest && g.NavMoveDir == ImGuiDir_Down) // Nav-Down to open
        {
            want_open = true;
            NavMoveRequestCancel();
        }
    }

    if (!enabled) // explicitly close if an open menu becomes disabled, facilitate users code a lot in pattern such as 'if (BeginMenu("options", has_object)) { ..use object.. }'
        want_close = true;
    if (want_close && IsPopupOpen(id))
        ClosePopupToLevel(g.CurrentPopupStack.Size);

    if (!menu_is_open && want_open && g.OpenPopupStack.Size > g.CurrentPopupStack.Size)
    {
        // Don't recycle same menu level in the same frame, first close the other menu and yield for a frame.
        OpenPopup(label);
        return false;
    }

    menu_is_open |= want_open;
    if (want_open)
        OpenPopup(label);

    if (menu_is_open)
    {
        // Sub-menus are ChildWindow so that mouse can be hovering across them (otherwise top-most popup menu would steal focus and not allow hovering on parent menu)
        SetNextWindowPos(popup_pos, ImGuiCond_Always);
        ImGuiWindowFlags flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_NoMove | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoSavedSettings | ((window->Flags & (ImGuiWindowFlags_Popup|ImGuiWindowFlags_ChildMenu)) ? ImGuiWindowFlags_ChildMenu|ImGuiWindowFlags_ChildWindow : ImGuiWindowFlags_ChildMenu);
        menu_is_open = BeginPopupEx(id, flags); // menu_is_open can be 'false' when the popup is completely clipped (e.g. zero size display)
    }

    return menu_is_open;
}